

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void google::protobuf::Option::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  string *psVar2;
  Any *pAVar3;
  size_type sVar4;
  Arena *arena;
  undefined8 uVar5;
  char *pcVar6;
  Arena *arena_00;
  Option *_this;
  Option *local_28 [2];
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  _this = (Option *)to_msg;
  local_28[0] = (Option *)from_msg;
  psVar2 = absl::lts_20240722::log_internal::
           Check_NEImpl<google::protobuf::Option_const*,google::protobuf::Option*>
                     (local_28,&_this,"&from != _this");
  if (psVar2 == (string *)0x0) {
    psVar2 = (string *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if (psVar2->_M_string_length != 0) {
      arena = (Arena *)(_this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>(&(_this->field_0)._impl_.name_,psVar2,arena);
    }
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[2]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        pcVar6 = "from._impl_.value_ != nullptr";
        sVar4 = 0x1d;
        uVar5 = 0x95b;
        goto LAB_001a226a;
      }
      pAVar3 = (_this->field_0)._impl_.value_;
      if (pAVar3 == (Any *)0x0) {
        pAVar3 = (Any *)Arena::CopyConstruct<google::protobuf::Any>(arena_00,from_msg_00);
        (_this->field_0)._impl_.value_ = pAVar3;
      }
      else {
        Any::MergeImpl((MessageLite *)pAVar3,from_msg_00);
      }
    }
    (_this->field_0)._impl_._has_bits_.has_bits_[0] =
         (_this->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(_this->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  pcVar6 = (psVar2->_M_dataplus)._M_p;
  sVar4 = psVar2->_M_string_length;
  uVar5 = 0x952;
LAB_001a226a:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/type.pb.cc"
             ,uVar5,sVar4,pcVar6);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void Option::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Option*>(&to_msg);
  auto& from = static_cast<const Option&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Option)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_name().empty()) {
    _this->_internal_set_name(from._internal_name());
  }
  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    ABSL_DCHECK(from._impl_.value_ != nullptr);
    if (_this->_impl_.value_ == nullptr) {
      _this->_impl_.value_ =
          ::google::protobuf::Message::CopyConstruct<::google::protobuf::Any>(arena, *from._impl_.value_);
    } else {
      _this->_impl_.value_->MergeFrom(*from._impl_.value_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}